

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-run-nowait.c
# Opt level: O1

int run_test_run_nowait(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_timer_t *puVar3;
  int64_t eval_b;
  int64_t eval_a;
  void *local_10;
  
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100,100);
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,2);
  if (iVar1 == 0) {
    run_test_run_nowait_cold_3();
  }
  else {
    local_10 = (void *)(ulong)timer_called;
    if (local_10 == (void *)0x0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_10 = (void *)0x0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (local_10 == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ba2d3;
    }
  }
  run_test_run_nowait_cold_1();
LAB_001ba2d3:
  puVar3 = (uv_timer_t *)&stack0xfffffffffffffff0;
  run_test_run_nowait_cold_2();
  if (puVar3 == &timer_handle) {
    timer_called = 1;
    return 0x37a888;
  }
  timer_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(run_nowait) {
  int r;
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  r = uv_run(uv_default_loop(), UV_RUN_NOWAIT);
  ASSERT(r);
  ASSERT_OK(timer_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}